

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O0

RealType OpenMD::MoLocator::getMolMass(MoleculeStamp *molStamp,ForceField *myFF)

{
  size_t sVar1;
  AtomStamp *currAtomStamp;
  size_t i;
  RealType totMass;
  uint nAtoms;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  MoleculeStamp *in_stack_ffffffffffffff90;
  ForceField *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  AtomStamp *local_30;
  _Base_ptr local_28;
  double local_20;
  uint local_14;
  
  local_20 = 0.0;
  sVar1 = MoleculeStamp::getNAtoms((MoleculeStamp *)0x2ddba1);
  local_14 = (uint)sVar1;
  for (local_28 = (_Base_ptr)0x0; local_28 < (_Base_ptr)(ulong)local_14;
      local_28 = (_Base_ptr)((long)&local_28->_M_color + 1)) {
    local_30 = MoleculeStamp::getAtomStamp(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    in_stack_ffffffffffffff90 = (MoleculeStamp *)&stack0xffffffffffffffb0;
    AtomStamp::getType_abi_cxx11_
              ((AtomStamp *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    in_stack_ffffffffffffff98 =
         (ForceField *)getAtomMass(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_20 = (double)in_stack_ffffffffffffff98 + local_20;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return local_20;
}

Assistant:

RealType MoLocator::getMolMass(MoleculeStamp* molStamp, ForceField* myFF) {
    unsigned int nAtoms;
    RealType totMass = 0;
    nAtoms           = molStamp->getNAtoms();

    for (std::size_t i = 0; i < nAtoms; i++) {
      AtomStamp* currAtomStamp = molStamp->getAtomStamp(i);
      totMass += getAtomMass(currAtomStamp->getType(), myFF);
    }
    return totMass;
  }